

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_type.cpp
# Opt level: O1

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseType
          (Parser *this,
          unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *caps)

{
  pointer puVar1;
  Lexer *lexer;
  Token *tokId;
  __uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true> _Var2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  __uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true> _Var6;
  __uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true> _Var7;
  bool bVar8;
  long lVar9;
  Lexer *pLVar10;
  unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *in_RDX;
  Parser *this_00;
  pointer __p;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> expr;
  Position pos;
  Position local_90;
  __uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_> local_78;
  Lexer *local_70;
  Position local_68;
  undefined1 local_48 [16];
  
  puVar1 = (caps->_M_t).
           super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
           ._M_t.
           super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
           .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl[3].required.
           super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_68.line =
       *(size_t *)
        &puVar1[3]._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>;
  local_68.startIndex =
       *(size_t *)
        &puVar1[4]._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>;
  local_68.endIndex =
       *(size_t *)
        &puVar1[5]._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>;
  sanityExpect((Parser *)caps,TOK_KW_TYPE);
  parseExpression((Parser *)&local_70,(Precedence)caps);
  pLVar10 = local_70;
  if (local_70 == (Lexer *)0x0) {
    puVar1 = (caps->_M_t).
             super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
             ._M_t.
             super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
             .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl[3].required.
             super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_90.line = (size_t)operator_new(0x38);
    _Var6.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
         puVar1[3]._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>;
    _Var7.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
         puVar1[4]._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>;
    _Var2.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
         puVar1[5]._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>;
    ((Error<pfederc::SyntaxErrorCode> *)local_90.line)->logLevel = LVL_ERROR;
    ((Error<pfederc::SyntaxErrorCode> *)local_90.line)->err = STX_ERR_INVALID_TYPE_EXPR;
    (((Error<pfederc::SyntaxErrorCode> *)local_90.line)->pos).line =
         (size_t)_Var6.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
                 _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                 super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    (((Error<pfederc::SyntaxErrorCode> *)local_90.line)->pos).startIndex =
         (size_t)_Var7.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
                 _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                 super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    (((Error<pfederc::SyntaxErrorCode> *)local_90.line)->pos).endIndex =
         (size_t)_Var2.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
                 _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                 super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    (((Error<pfederc::SyntaxErrorCode> *)local_90.line)->extraPos).
    super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (((Error<pfederc::SyntaxErrorCode> *)local_90.line)->extraPos).
    super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (((Error<pfederc::SyntaxErrorCode> *)local_90.line)->extraPos).
    super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = (Parser *)&stack0xffffffffffffffc8;
  }
  else {
    if (*(int *)&(local_70->filePath)._M_dataplus._M_p == 0x12) {
      if (local_70->_vptr_Lexer != (_func_int **)&PTR__BiOpExpr_00128998) {
        __cxa_bad_cast();
      }
      if ((short)(local_70->fileContent)._M_string_length == 0x42) {
        if (local_70->_vptr_Lexer != (_func_int **)&PTR__BiOpExpr_00128998) {
LAB_0011822a:
          __cxa_bad_cast();
        }
        lVar9 = *(long *)((long)&(local_70->fileContent).field_2 + 8);
        if (*(int *)(lVar9 + 0x18) == 0) {
          lVar9 = __dynamic_cast(lVar9,&Expr::typeinfo,&TokenExpr::typeinfo,0);
          if (lVar9 == 0) goto LAB_0011822a;
          bVar8 = Token::operator==(*(Token **)(lVar9 + 0x38),TOK_ID);
          if (bVar8) {
            Position::operator+(&local_90,&local_68,
                                (Position *)&(pLVar10->filePath)._M_string_length);
            local_68.endIndex = local_90.endIndex;
            local_68.line = local_90.line;
            local_68.startIndex =
                 CONCAT44(local_90.startIndex._4_4_,(undefined4)local_90.startIndex);
            lexer = (Lexer *)(caps->_M_t).
                             super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                             .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl;
            lVar9 = __dynamic_cast(*(undefined8 *)((long)&(pLVar10->fileContent).field_2 + 8),
                                   &Expr::typeinfo,&TokenExpr::typeinfo,0);
            if (lVar9 == 0) goto LAB_0011822a;
            tokId = *(Token **)(lVar9 + 0x38);
            local_78._M_t.
            super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
            super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
                 (tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)
                 (pLVar10->fileContent).field_2._M_allocated_capacity;
            (pLVar10->fileContent).field_2._M_allocated_capacity = 0;
            pLVar10 = (Lexer *)operator_new(0x50);
            TypeExpr::TypeExpr((TypeExpr *)pLVar10,lexer,&local_68,in_RDX,tokId,
                               (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                               &local_78);
            local_90.line = 0;
            this->lexer = pLVar10;
            std::unique_ptr<pfederc::TypeExpr,_std::default_delete<pfederc::TypeExpr>_>::~unique_ptr
                      ((unique_ptr<pfederc::TypeExpr,_std::default_delete<pfederc::TypeExpr>_> *)
                       &local_90);
            if (local_78._M_t.
                super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl !=
                (_Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)0x0) {
              (**(code **)(*(long *)local_78._M_t.
                                    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                                    .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl + 8)
              )();
            }
            goto LAB_00118203;
          }
        }
        lVar9 = *(long *)((long)&(pLVar10->fileContent).field_2 + 8);
        local_90.line = (size_t)operator_new(0x38);
        sVar4 = *(size_t *)(lVar9 + 0x20);
        sVar5 = *(size_t *)(lVar9 + 0x28);
        sVar3 = *(size_t *)(lVar9 + 0x30);
        ((Error<pfederc::SyntaxErrorCode> *)local_90.line)->logLevel = LVL_ERROR;
        ((Error<pfederc::SyntaxErrorCode> *)local_90.line)->err = STX_ERR_EXPECTED_ID;
        (((Error<pfederc::SyntaxErrorCode> *)local_90.line)->pos).line = sVar4;
        (((Error<pfederc::SyntaxErrorCode> *)local_90.line)->pos).startIndex = sVar5;
        (((Error<pfederc::SyntaxErrorCode> *)local_90.line)->pos).endIndex = sVar3;
        (((Error<pfederc::SyntaxErrorCode> *)local_90.line)->extraPos).
        super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (((Error<pfederc::SyntaxErrorCode> *)local_90.line)->extraPos).
        super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (((Error<pfederc::SyntaxErrorCode> *)local_90.line)->extraPos).
        super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        this_00 = (Parser *)local_48;
        goto LAB_001181d4;
      }
    }
    local_90.line = (size_t)operator_new(0x38);
    sVar4 = (pLVar10->filePath)._M_string_length;
    sVar5 = (pLVar10->filePath).field_2._M_allocated_capacity;
    sVar3 = *(size_t *)((long)&(pLVar10->filePath).field_2 + 8);
    ((Error<pfederc::SyntaxErrorCode> *)local_90.line)->logLevel = LVL_ERROR;
    ((Error<pfederc::SyntaxErrorCode> *)local_90.line)->err = STX_ERR_INVALID_TYPE_EXPR;
    (((Error<pfederc::SyntaxErrorCode> *)local_90.line)->pos).line = sVar4;
    (((Error<pfederc::SyntaxErrorCode> *)local_90.line)->pos).startIndex = sVar5;
    (((Error<pfederc::SyntaxErrorCode> *)local_90.line)->pos).endIndex = sVar3;
    (((Error<pfederc::SyntaxErrorCode> *)local_90.line)->extraPos).
    super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (((Error<pfederc::SyntaxErrorCode> *)local_90.line)->extraPos).
    super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (((Error<pfederc::SyntaxErrorCode> *)local_90.line)->extraPos).
    super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = (Parser *)(local_48 + 8);
  }
LAB_001181d4:
  generateError(this_00,(unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)caps);
  std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
            ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)this_00);
  if ((Error<pfederc::SyntaxErrorCode> *)local_90.line != (Error<pfederc::SyntaxErrorCode> *)0x0) {
    std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
              ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_90,
               (Error<pfederc::SyntaxErrorCode> *)local_90.line);
  }
  this->lexer = (Lexer *)0x0;
LAB_00118203:
  if (local_70 != (Lexer *)0x0) {
    (*local_70->_vptr_Lexer[1])();
  }
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseType(std::unique_ptr<Capabilities> &&caps) noexcept {
  Position pos(lexer.getCurrentToken()->getPosition());
  sanityExpect(TokenType::TOK_KW_TYPE);

  std::unique_ptr<Expr> expr(parseExpression());
  if (!expr) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_INVALID_TYPE_EXPR, lexer.getCurrentToken()->getPosition()));
    return nullptr;
  }

  if (!isBiOpExpr(*expr, TokenType::TOK_OP_NONE)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_INVALID_TYPE_EXPR, expr->getPosition()));
    return nullptr;
  }

  BiOpExpr &biopexpr = dynamic_cast<BiOpExpr&>(*expr);

  if (!isTokenExpr(biopexpr.getRight(), TokenType::TOK_ID)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_ID, biopexpr.getRight().getPosition()));
    return nullptr;
  }

  pos = pos + biopexpr.getPosition();

  return std::make_unique<TypeExpr>(lexer, pos, std::move(caps),
      dynamic_cast<const TokenExpr&>(biopexpr.getRight()).getTokenPtr(),
      biopexpr.getLeftPtr());
}